

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

void __thiscall
cmCTestSubmitHandler::ResponseParser::StartElement(ResponseParser *this,string *name,char **atts)

{
  bool bVar1;
  char *pcVar2;
  char **atts_local;
  string *name_local;
  ResponseParser *this_local;
  
  std::vector<char,_std::allocator<char>_>::clear(&this->CurrentValue);
  bVar1 = std::operator==(name,"cdash");
  if (bVar1) {
    pcVar2 = cmXMLParser::FindAttribute(atts,"version");
    std::__cxx11::string::operator=((string *)&this->CDashVersion,pcVar2);
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name, const char** atts)
    {
    this->CurrentValue.clear();
    if(name == "cdash")
      {
      this->CDashVersion = this->FindAttribute(atts, "version");
      }
    }